

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog_unix.cpp
# Opt level: O3

void __thiscall QPageSetupWidget::setupPrinter(QPageSetupWidget *this)

{
  QHBoxLayout *pQVar1;
  code *UNRECOVERED_JUMPTABLE;
  undefined4 uVar2;
  undefined8 extraout_RDX;
  
  pQVar1 = this[1].super_Ui_QPageSetupWidget.horizontalLayout_3;
  (**(code **)(*(long *)pQVar1 + 0x48))
            (pQVar1,&this[1].super_Ui_QPageSetupWidget.horizontalSpacer_4);
  pQVar1 = this[1].super_Ui_QPageSetupWidget.horizontalLayout_3;
  uVar2 = QPageLayout::orientation();
  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pQVar1 + 0x58);
  (*UNRECOVERED_JUMPTABLE)(pQVar1,uVar2,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void QPageSetupWidget::setupPrinter() const
{
    m_printer->setPageLayout(m_pageLayout);
    m_printer->setPageOrientation(m_pageLayout.orientation());
#if QT_CONFIG(cups)
    QCUPSSupport::PagesPerSheet pagesPerSheet = qvariant_cast<QCUPSSupport::PagesPerSheet>(m_ui.pagesPerSheetCombo->currentData()
);
    QCUPSSupport::PagesPerSheetLayout pagesPerSheetLayout = qvariant_cast<QCUPSSupport::PagesPerSheetLayout>(m_ui.pagesPerSheetLayoutCombo->currentData()
);
    QCUPSSupport::setPagesPerSheetLayout(m_printer, pagesPerSheet, pagesPerSheetLayout);
#endif
#ifdef PSD_ENABLE_PAPERSOURCE
    m_printer->setPaperSource((QPrinter::PaperSource)m_ui.paperSource->currentIndex());
#endif
}